

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int saveGlobal(void *ptr,mpt_path *p,mpt_value *val,int last,int curr)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((~curr & 3U) == 0) {
    iVar1 = (**(code **)(*ptr + 8))();
    if (iVar1 < 0) {
      mpt_log((mpt_logger *)0x0,"mpt_init::TypeConfig",3,"%s","failed to set global config element")
      ;
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int saveGlobal(void *ptr, const MPT_STRUCT(path) *p, const MPT_STRUCT(value) *val, int last, int curr)
{
	MPT_INTERFACE(config) *cfg = ptr;
	
	if ((curr & 0x3) != MPT_PARSEFLAG(Option)) {
		return 0;
	}
	if ((last = cfg->_vptr->assign(cfg, p, val)) < 0) {
		mpt_log(0, "mpt_init::TypeConfig", MPT_LOG(Error), "%s",
		        MPT_tr("failed to set global config element"));
		return last;
	}
	return 0;
}